

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

int CMdo_non_CM_handler(CMConnection conn,int header,char *buffer,size_t length)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(uint)foreign_handler_count;
  if (foreign_handler_count < 1) {
    uVar3 = 0;
  }
  uVar1 = 0;
  do {
    uVar4 = uVar1;
    if (uVar3 * 0x10 + 0x10 == uVar4 + 0x10) {
      return -1;
    }
    uVar1 = uVar4 + 0x10;
  } while (*(int *)((long)&foreign_handler_list->header + uVar4) != header);
  iVar2 = (**(code **)((long)&foreign_handler_list->handler + uVar4))(conn,conn->trans);
  return iVar2;
}

Assistant:

int
 CMdo_non_CM_handler(CMConnection conn, int header, char *buffer, size_t length)
 {
     int i = 0;
     while (i < foreign_handler_count) {
	 if (foreign_handler_list[i].header == header) {
	     return foreign_handler_list[i].handler(conn, conn->trans, buffer, 
					     length);
	 }
	 i++;
     }
     return -1;
 }